

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

Aig_Obj_t * Fra_LcrCreatePart_rec(Fra_Cla_t *pCla,Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  
  if (((ulong)pObj & 1) == 0) {
    if (pObj->TravId == p->nTravIds) {
      pAVar1 = (Aig_Obj_t *)(pObj->field_5).pData;
    }
    else {
      pObj->TravId = p->nTravIds;
      if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
        pAVar3 = pCla->pMemRepr[pObj->Id];
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          pAVar1 = Aig_ObjCreateCi(pNew);
        }
        else {
          pAVar1 = Fra_LcrCreatePart_rec(pCla,pNew,p,pAVar3);
          (pObj->field_5).pData = pAVar1;
          pAVar1 = (Aig_Obj_t *)
                   ((ulong)((*(uint *)&pObj->field_0x18 ^ *(uint *)&pAVar3->field_0x18) >> 3 & 1) ^
                   (ulong)pAVar1);
        }
      }
      else {
        Fra_LcrCreatePart_rec(pCla,pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        Fra_LcrCreatePart_rec(pCla,pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
        uVar2 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
        if (uVar2 == 0) {
          pAVar1 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar2 + 0x28));
        }
        uVar2 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
        if (uVar2 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar2 + 0x28));
        }
        pAVar1 = Aig_And(pNew,pAVar1,pAVar3);
      }
      (pObj->field_5).pData = pAVar1;
    }
    return pAVar1;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraLcr.c"
                ,0x18c,
                "Aig_Obj_t *Fra_LcrCreatePart_rec(Fra_Cla_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)"
               );
}

Assistant:

Aig_Obj_t * Fra_LcrCreatePart_rec( Fra_Cla_t * pCla, Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return (Aig_Obj_t *)pObj->pData;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
//        Aig_Obj_t * pRepr = Fra_ClassObjRepr(pObj);
        Aig_Obj_t * pRepr = pCla->pMemRepr[pObj->Id];
        if ( pRepr == NULL )
            pObj->pData = Aig_ObjCreateCi( pNew );
        else
        {
            pObj->pData = Fra_LcrCreatePart_rec( pCla, pNew, p, pRepr );
            pObj->pData = Aig_NotCond( (Aig_Obj_t *)pObj->pData, pRepr->fPhase ^ pObj->fPhase );
        }
        return (Aig_Obj_t *)pObj->pData;
    }
    Fra_LcrCreatePart_rec( pCla, pNew, p, Aig_ObjFanin0(pObj) );
    Fra_LcrCreatePart_rec( pCla, pNew, p, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}